

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O2

void __thiscall
PlanningUnitMADPDiscrete::GetActionObservationHistoryArrays
          (PlanningUnitMADPDiscrete *this,Index agentI,Index aohI,Index t,Index *aIs,Index *oIs)

{
  undefined1 auVar1 [16];
  Index IVar2;
  int iVar3;
  const_reference this_00;
  const_reference pvVar4;
  size_t nrO;
  undefined4 extraout_var;
  ulong uVar5;
  long lVar6;
  Index aoI;
  uint uVar7;
  undefined8 extraout_XMM0_Qa;
  undefined1 extraout_var_00 [56];
  undefined1 auVar10 [64];
  undefined1 in_XMM2 [16];
  size_t nrA;
  undefined1 auVar9 [64];
  undefined1 auVar8 [16];
  undefined1 extraout_var_01 [56];
  
  this_00 = std::
            vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
            ::at(&this->_m_firstAOHIforT,(ulong)agentI);
  pvVar4 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::at
                     (this_00,(ulong)t);
  IVar2 = Globals::CastLIndexToIndex(*pvVar4);
  uVar7 = aohI - IVar2;
  nrO = (**(code **)((long)*this->_m_madp + 0xc0))(this->_m_madp,agentI);
  auVar9._8_56_ = extraout_var_00;
  auVar9._0_8_ = extraout_XMM0_Qa;
  auVar8 = auVar9._0_16_;
  iVar3 = (*(this->super_PlanningUnit)._vptr_PlanningUnit[7])(this,(ulong)agentI);
  nrA = CONCAT44(extraout_var,iVar3);
  iVar3 = t - 1;
  lVar6 = 0;
  auVar8 = vcvtusi2sd_avx512f(auVar8,nrA * nrO);
  for (; (ulong)t << 2 != lVar6; lVar6 = lVar6 + 4) {
    auVar1 = vcvtusi2sd_avx512f(in_XMM2,iVar3);
    auVar10._0_8_ = pow(auVar8._0_8_,auVar1._0_8_);
    auVar10._8_56_ = extraout_var_01;
    uVar5 = vcvttsd2usi_avx512f(auVar10._0_16_);
    aoI = (Index)(uVar7 / uVar5);
    uVar7 = uVar7 - (int)uVar5 * aoI;
    IVar2 = IndexTools::ActionObservation_to_ActionIndex(aoI,nrA,nrO);
    *(Index *)((long)aIs + lVar6) = IVar2;
    IVar2 = IndexTools::ActionObservation_to_ObservationIndex(aoI,nrA,nrO);
    iVar3 = iVar3 + -1;
    *(Index *)((long)oIs + lVar6) = IVar2;
  }
  return;
}

Assistant:

void 
PlanningUnitMADPDiscrete::GetActionObservationHistoryArrays
    (Index agentI, Index aohI, Index t,  Index aIs[], Index oIs[]) const
{
    //substract the offset to find out what is the index within the time-step-t-
    //observation-histories.
    Index aohIwithinThisT = aohI - CastLIndexToIndex(_m_firstAOHIforT.at(agentI).at(t));
   
    Index remainder = aohIwithinThisT;
    size_t vec_size = t; // the number of 'JAO' we are searching
        
    size_t nrO = GetNrObservations(agentI);
    size_t nrA = GetNrActions(agentI);
    size_t nrAO = nrO*nrA;
    for(Index t2=0; t2 < vec_size ; t2++)
    {
        // for explanation see GetJointActionObservationHistoryArrays()
        //
        // we start with stage
        size_t stage = (t-1) - t2;
        //we are going to calculate the joa that took place at time stage
        size_t b = (size_t) pow((double)nrAO, (double)(stage));

        Index aoI_t2 = remainder / b;
        remainder -= aoI_t2 * b;

        aIs[t2] = IndexTools::
            ActionObservation_to_ActionIndex(aoI_t2, nrA, nrO);
        oIs[t2] = IndexTools::
            ActionObservation_to_ObservationIndex(aoI_t2, nrA, nrO);
    }

}